

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O2

uint Curl_uint_bset_count(uint_bset *bset)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  for (uVar2 = 0; bset->nslots != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = bset->slots[uVar2];
    if (uVar3 != 0) {
      uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar1 = uVar1 + (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
    }
  }
  return uVar1;
}

Assistant:

unsigned int Curl_uint_bset_count(struct uint_bset *bset)
{
  unsigned int i;
  unsigned int n = 0;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i])
      n += CURL_POPCOUNT64(bset->slots[i]);
  }
  return n;
}